

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_scandir_empty_dir(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  ssize_t sVar4;
  int iVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uint uVar6;
  int extraout_EAX_03;
  int iVar7;
  int extraout_EAX_04;
  int extraout_EAX_05;
  uv_loop_t *puVar8;
  uv_loop_t *puVar9;
  uv_fs_t *extraout_RAX;
  uv_fs_t *puVar10;
  long extraout_RAX_00;
  uv_buf_t *bufs;
  uv_os_fd_t uVar11;
  char *pcVar12;
  uv_fs_t *puVar13;
  uv_fs_t *puVar14;
  undefined8 unaff_R12;
  long lVar15;
  char *pcVar16;
  uv_fs_t *unaff_R15;
  ulong uVar17;
  bool bVar18;
  uv_buf_t uVar19;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_dirent_t dent;
  uv_fs_t req;
  char acStack_e0a [2];
  uv_loop_t *puStack_e08;
  ssize_t sStack_d78;
  uv_loop_t *puStack_d70;
  undefined8 uStack_d68;
  ssize_t asStack_d20 [2];
  uv_buf_t uStack_d10;
  uv_buf_t uStack_d00;
  uv_loop_t *puStack_ce8;
  ssize_t sStack_c98;
  uv_loop_t *puStack_c90;
  uv_fs_t *puStack_c88;
  uv_fs_t *puStack_c80;
  long lStack_c78;
  long lStack_c70;
  uv_loop_t *puStack_c68;
  char *pcStack_c50;
  char *pcStack_c48;
  undefined1 auStack_c40 [16];
  uv_buf_t uStack_c30;
  uv_buf_t uStack_c20;
  uv_buf_t uStack_c10;
  char *apcStack_c00 [32];
  char acStack_b00 [256];
  char acStack_a00 [128];
  char acStack_980 [128];
  uv_loop_t *puStack_900;
  uv_fs_t *puStack_8f8;
  long lStack_8c0;
  char *pcStack_8b8;
  uv_fs_t *puStack_8b0;
  undefined1 auStack_830 [96];
  void *pvStack_7d0;
  char *pcStack_7c8;
  uv_loop_t *puStack_668;
  uv_fs_t *puStack_660;
  long lStack_658;
  long lStack_650;
  uv_dirent_t uStack_648;
  undefined1 auStack_638 [488];
  undefined1 auStack_450 [48];
  code *pcStack_420;
  undefined1 auStack_410 [16];
  uv_dirent_t uStack_400;
  uv_fs_t uStack_3f0;
  uv_loop_t *puStack_230;
  uv_fs_t *puStack_228;
  code *pcStack_218;
  uv_dirent_t uStack_210;
  code *pcStack_200;
  undefined1 local_1f0 [16];
  uv_dirent_t local_1e0;
  uv_fs_t local_1d0;
  
  uStack_d10.len = (size_t)uStack_d10.base;
  auStack_c40._8_8_ = auStack_c40._0_8_;
  pcStack_200 = (code *)0x192c83;
  loop = uv_default_loop();
  pcVar12 = "./empty_dir/";
  pcStack_200 = (code *)0x192cab;
  uv_fs_mkdir((uv_loop_t *)0x0,&local_1d0,"./empty_dir/",0x1ff,(uv_fs_cb)0x0);
  pcStack_200 = (code *)0x192cb3;
  uv_fs_req_cleanup(&local_1d0);
  pcStack_200 = (code *)0x192cc5;
  memset(&local_1d0,0xdb,0x1c0);
  pcStack_200 = (code *)0x192cd7;
  iVar5 = uv_fs_scandir((uv_loop_t *)0x0,&local_1d0,"./empty_dir/",0,(uv_fs_cb)0x0);
  local_1e0.name = (char *)(long)iVar5;
  local_1f0._0_8_ = (uv_loop_t *)0x0;
  if (local_1e0.name == (char *)0x0) {
    local_1e0.name = (char *)local_1d0.result;
    local_1f0._0_8_ = (uv_loop_t *)0x0;
    if ((char *)local_1d0.result != (char *)0x0) goto LAB_00192e8d;
    if (local_1d0.ptr != (void *)0x0) goto LAB_00192e9c;
    local_1f0._0_8_ = (uv_loop_t *)0xfffffffffffff001;
    pcStack_200 = (code *)0x192d46;
    iVar5 = uv_fs_scandir_next(&local_1d0,&local_1e0);
    local_1f0._8_8_ = SEXT48(iVar5);
    if (local_1f0._0_8_ != local_1f0._8_8_) goto LAB_00192ea1;
    pcStack_200 = (code *)0x192d67;
    uv_fs_req_cleanup(&local_1d0);
    pcStack_200 = (code *)0x192d8a;
    iVar5 = uv_fs_scandir(loop,&scandir_req,"./empty_dir/",0,empty_scandir_cb);
    local_1f0._0_8_ = SEXT48(iVar5);
    local_1f0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_1f0._0_8_ != (uv_loop_t *)0x0) goto LAB_00192eb0;
    local_1f0._0_8_ = SEXT48(scandir_cb_count);
    local_1f0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_1f0._0_8_ != (uv_loop_t *)0x0) goto LAB_00192ebf;
    pcStack_200 = (code *)0x192ddd;
    uv_run(loop,UV_RUN_DEFAULT);
    local_1f0._0_8_ = (uv_loop_t *)0x1;
    local_1f0._8_8_ = SEXT48(scandir_cb_count);
    if ((uv_loop_t *)local_1f0._8_8_ != (uv_loop_t *)0x1) goto LAB_00192ece;
    pcStack_200 = (code *)0x192e1a;
    uv_fs_rmdir((uv_loop_t *)0x0,&local_1d0,"./empty_dir/",(uv_fs_cb)0x0);
    pcStack_200 = (code *)0x192e22;
    uv_fs_req_cleanup(&local_1d0);
    pcVar12 = (char *)loop;
    pcStack_200 = (code *)0x192e3a;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    pcStack_200 = (code *)0x192e44;
    uv_run((uv_loop_t *)pcVar12,UV_RUN_DEFAULT);
    local_1f0._0_8_ = (uv_loop_t *)0x0;
    pcStack_200 = (code *)0x192e59;
    iVar5 = uv_loop_close(loop);
    local_1f0._8_8_ = SEXT48(iVar5);
    if (local_1f0._0_8_ == local_1f0._8_8_) {
      pcStack_200 = (code *)0x192e71;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_200 = (code *)0x192e8d;
    run_test_fs_scandir_empty_dir_cold_1();
LAB_00192e8d:
    pcStack_200 = (code *)0x192e9c;
    run_test_fs_scandir_empty_dir_cold_2();
LAB_00192e9c:
    pcStack_200 = (code *)0x192ea1;
    run_test_fs_scandir_empty_dir_cold_3();
LAB_00192ea1:
    pcStack_200 = (code *)0x192eb0;
    run_test_fs_scandir_empty_dir_cold_4();
LAB_00192eb0:
    pcStack_200 = (code *)0x192ebf;
    run_test_fs_scandir_empty_dir_cold_5();
LAB_00192ebf:
    pcStack_200 = (code *)0x192ece;
    run_test_fs_scandir_empty_dir_cold_6();
LAB_00192ece:
    pcStack_200 = (code *)0x192edd;
    run_test_fs_scandir_empty_dir_cold_7();
  }
  puVar14 = (uv_fs_t *)local_1f0;
  pcStack_200 = empty_scandir_cb;
  run_test_fs_scandir_empty_dir_cold_8();
  if (puVar14 == &scandir_req) {
    uStack_210.name = (char *)(long)scandir_req.fs_type;
    pcStack_218 = (code *)0x16;
    if (uStack_210.name != (char *)0x16) goto LAB_00192f97;
    uStack_210.name = (char *)scandir_req.result;
    pcStack_218 = (code *)0x0;
    if (scandir_req.result != 0) goto LAB_00192fa6;
    if (scandir_req.ptr != (void *)0x0) goto LAB_00192fb5;
    pcStack_218 = (code *)0xfffffffffffff001;
    puStack_228 = (uv_fs_t *)0x192f68;
    iVar5 = uv_fs_scandir_next(&scandir_req,&uStack_210);
    pcStack_200 = (code *)(long)iVar5;
    if (pcStack_218 == pcStack_200) {
      puStack_228 = (uv_fs_t *)0x192f87;
      uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return extraout_EAX;
    }
  }
  else {
    puStack_228 = (uv_fs_t *)0x192f97;
    empty_scandir_cb_cold_1();
LAB_00192f97:
    puStack_228 = (uv_fs_t *)0x192fa6;
    empty_scandir_cb_cold_2();
LAB_00192fa6:
    puStack_228 = (uv_fs_t *)0x192fb5;
    empty_scandir_cb_cold_3();
LAB_00192fb5:
    puStack_228 = (uv_fs_t *)0x192fba;
    empty_scandir_cb_cold_4();
  }
  puStack_228 = (uv_fs_t *)run_test_fs_scandir_non_existent_dir;
  empty_scandir_cb_cold_5();
  pcStack_420 = (code *)0x192fd8;
  puStack_230 = (uv_loop_t *)pcVar12;
  puStack_228 = &local_1d0;
  loop = uv_default_loop();
  pcVar12 = "./non_existent_dir/";
  puVar14 = &uStack_3f0;
  pcStack_420 = (code *)0x192ffa;
  uv_fs_rmdir((uv_loop_t *)0x0,puVar14,"./non_existent_dir/",(uv_fs_cb)0x0);
  pcStack_420 = (code *)0x193002;
  uv_fs_req_cleanup(puVar14);
  pcStack_420 = (code *)0x193014;
  memset(puVar14,0xdb,0x1c0);
  pcStack_420 = (code *)0x193026;
  iVar5 = uv_fs_scandir((uv_loop_t *)0x0,puVar14,"./non_existent_dir/",0,(uv_fs_cb)0x0);
  uStack_400.name = (char *)(long)iVar5;
  auStack_410._0_8_ = (uv_loop_t *)0xfffffffffffffffe;
  if ((uv__queue *)uStack_400.name == (uv__queue *)0xfffffffffffffffe) {
    uStack_400.name = (char *)uStack_3f0.result;
    auStack_410._0_8_ = (uv_loop_t *)0xfffffffffffffffe;
    if ((uv__queue *)uStack_3f0.result != (uv__queue *)0xfffffffffffffffe) goto LAB_001931bc;
    if (uStack_3f0.ptr != (void *)0x0) goto LAB_001931cb;
    auStack_410._0_8_ = (uv_loop_t *)0xfffffffffffffffe;
    pcStack_420 = (code *)0x193095;
    iVar5 = uv_fs_scandir_next(&uStack_3f0,&uStack_400);
    auStack_410._8_8_ = SEXT48(iVar5);
    if (auStack_410._0_8_ != auStack_410._8_8_) goto LAB_001931d0;
    pcStack_420 = (code *)0x1930b6;
    uv_fs_req_cleanup(&uStack_3f0);
    pcStack_420 = (code *)0x1930d9;
    iVar5 = uv_fs_scandir(loop,&scandir_req,"./non_existent_dir/",0,non_existent_scandir_cb);
    auStack_410._0_8_ = SEXT48(iVar5);
    auStack_410._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_410._0_8_ != (uv_loop_t *)0x0) goto LAB_001931df;
    auStack_410._0_8_ = SEXT48(scandir_cb_count);
    auStack_410._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_410._0_8_ != (uv_loop_t *)0x0) goto LAB_001931ee;
    pcStack_420 = (code *)0x19312c;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar8 = loop;
    auStack_410._0_8_ = (uv_loop_t *)0x1;
    auStack_410._8_8_ = SEXT48(scandir_cb_count);
    if ((uv_loop_t *)auStack_410._8_8_ != (uv_loop_t *)0x1) goto LAB_001931fd;
    pcStack_420 = (code *)0x193169;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    pcStack_420 = (code *)0x193173;
    uv_run(puVar8,UV_RUN_DEFAULT);
    auStack_410._0_8_ = (uv_loop_t *)0x0;
    pcStack_420 = (code *)0x193188;
    iVar5 = uv_loop_close(loop);
    auStack_410._8_8_ = SEXT48(iVar5);
    pcVar12 = (char *)puVar8;
    if (auStack_410._0_8_ == auStack_410._8_8_) {
      pcStack_420 = (code *)0x1931a0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_420 = (code *)0x1931bc;
    run_test_fs_scandir_non_existent_dir_cold_1();
LAB_001931bc:
    pcStack_420 = (code *)0x1931cb;
    run_test_fs_scandir_non_existent_dir_cold_2();
LAB_001931cb:
    pcStack_420 = (code *)0x1931d0;
    run_test_fs_scandir_non_existent_dir_cold_3();
LAB_001931d0:
    pcStack_420 = (code *)0x1931df;
    run_test_fs_scandir_non_existent_dir_cold_4();
LAB_001931df:
    pcStack_420 = (code *)0x1931ee;
    run_test_fs_scandir_non_existent_dir_cold_5();
LAB_001931ee:
    pcStack_420 = (code *)0x1931fd;
    run_test_fs_scandir_non_existent_dir_cold_6();
LAB_001931fd:
    pcStack_420 = (code *)0x19320c;
    run_test_fs_scandir_non_existent_dir_cold_7();
  }
  puVar13 = (uv_fs_t *)auStack_410;
  pcStack_420 = non_existent_scandir_cb;
  run_test_fs_scandir_non_existent_dir_cold_8();
  if (puVar13 == &scandir_req) {
    auStack_450._32_8_ = SEXT48(scandir_req.fs_type);
    auStack_450._24_8_ = (code *)0x16;
    if ((void *)auStack_450._32_8_ != (void *)0x16) goto LAB_001932c6;
    auStack_450._32_8_ = scandir_req.result;
    auStack_450._24_8_ = (code *)0xfffffffffffffffe;
    if (scandir_req.result != -2) goto LAB_001932d5;
    if (scandir_req.ptr != (void *)0x0) goto LAB_001932e4;
    auStack_450._24_8_ = (code *)0xfffffffffffffffe;
    auStack_450._8_8_ = (uv_loop_t *)0x193297;
    iVar5 = uv_fs_scandir_next(&scandir_req,(uv_dirent_t *)(auStack_450 + 0x20));
    pcStack_420 = (code *)(long)iVar5;
    if ((code *)auStack_450._24_8_ == pcStack_420) {
      auStack_450._8_8_ = (uv_loop_t *)0x1932b6;
      uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return extraout_EAX_00;
    }
  }
  else {
    auStack_450._8_8_ = (uv_loop_t *)0x1932c6;
    non_existent_scandir_cb_cold_1();
LAB_001932c6:
    auStack_450._8_8_ = (uv_loop_t *)0x1932d5;
    non_existent_scandir_cb_cold_2();
LAB_001932d5:
    auStack_450._8_8_ = (uv_loop_t *)0x1932e4;
    non_existent_scandir_cb_cold_3();
LAB_001932e4:
    auStack_450._8_8_ = (uv_loop_t *)0x1932e9;
    non_existent_scandir_cb_cold_4();
  }
  auStack_450._8_8_ = run_test_fs_scandir_file;
  non_existent_scandir_cb_cold_5();
  auStack_638._472_8_ = (uv__queue *)0x193302;
  auStack_450._8_8_ = pcVar12;
  loop = uv_default_loop();
  auStack_638._472_8_ = (uv__queue *)0x193323;
  iVar5 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test/fixtures/empty_file",0,(uv_fs_cb)0x0);
  auStack_450._0_8_ = SEXT48(iVar5);
  auStack_638._480_8_ = (uv__queue *)0xffffffffffffffec;
  if ((uv__queue *)auStack_450._0_8_ == (uv__queue *)0xffffffffffffffec) {
    puVar13 = &scandir_req;
    auStack_638._472_8_ = (uv__queue *)0x193350;
    uv_fs_req_cleanup(&scandir_req);
    auStack_638._472_8_ = (uv__queue *)0x19336f;
    iVar5 = uv_fs_scandir(loop,&scandir_req,"test/fixtures/empty_file",0,file_scandir_cb);
    auStack_450._0_8_ = SEXT48(iVar5);
    auStack_638._480_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStack_450._0_8_ != (uv__queue *)0x0) goto LAB_0019343f;
    auStack_450._0_8_ = SEXT48(scandir_cb_count);
    auStack_638._480_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStack_450._0_8_ != (uv__queue *)0x0) goto LAB_0019344c;
    auStack_638._472_8_ = (uv__queue *)0x1933be;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar8 = loop;
    auStack_450._0_8_ = (uv__queue *)0x1;
    auStack_638._480_8_ = SEXT48(scandir_cb_count);
    if ((uv__queue *)auStack_638._480_8_ != (uv__queue *)0x1) goto LAB_00193459;
    auStack_638._472_8_ = (uv__queue *)0x1933f5;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    auStack_638._472_8_ = (uv__queue *)0x1933ff;
    uv_run(puVar8,UV_RUN_DEFAULT);
    auStack_450._0_8_ = (uv__queue *)0x0;
    auStack_638._472_8_ = (uv__queue *)0x193414;
    iVar5 = uv_loop_close(loop);
    auStack_638._480_8_ = SEXT48(iVar5);
    if (auStack_450._0_8_ == auStack_638._480_8_) {
      auStack_638._472_8_ = (uv__queue *)0x19342a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_638._472_8_ = (uv__queue *)0x19343f;
    run_test_fs_scandir_file_cold_1();
    puVar13 = (uv_fs_t *)pcVar12;
LAB_0019343f:
    auStack_638._472_8_ = (uv__queue *)0x19344c;
    run_test_fs_scandir_file_cold_2();
LAB_0019344c:
    auStack_638._472_8_ = (uv__queue *)0x193459;
    run_test_fs_scandir_file_cold_3();
LAB_00193459:
    puVar8 = (uv_loop_t *)puVar13;
    auStack_638._472_8_ = (uv__queue *)0x193466;
    run_test_fs_scandir_file_cold_4();
  }
  puVar13 = (uv_fs_t *)auStack_450;
  auStack_638._472_8_ = file_scandir_cb;
  run_test_fs_scandir_file_cold_5();
  if (puVar13 == &scandir_req) {
    auStack_638._472_8_ = SEXT48(scandir_req.fs_type);
    auStack_638._464_8_ = (uv__queue *)0x16;
    if ((uv__queue *)auStack_638._472_8_ != (uv__queue *)0x16) goto LAB_001934ed;
    auStack_638._472_8_ = scandir_req.result;
    auStack_638._464_8_ = (uv__queue *)0xffffffffffffffec;
    if (scandir_req.result != -0x14) goto LAB_001934fc;
    if (scandir_req.ptr == (void *)0x0) {
      auStack_638._448_8_ = (uv__io_cb)0x1934dd;
      uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return extraout_EAX_01;
    }
  }
  else {
    auStack_638._448_8_ = (uv__io_cb)0x1934ed;
    file_scandir_cb_cold_1();
LAB_001934ed:
    auStack_638._448_8_ = (uv__io_cb)0x1934fc;
    file_scandir_cb_cold_2();
LAB_001934fc:
    auStack_638._448_8_ = (uv__io_cb)0x19350b;
    file_scandir_cb_cold_3();
  }
  auStack_638._448_8_ = run_test_fs_scandir_early_exit;
  file_scandir_cb_cold_4();
  uStack_648.name = (char *)0x0;
  puStack_660 = (uv_fs_t *)0x193539;
  auStack_638._448_8_ = puVar8;
  iVar5 = uv_fs_scandir((uv_loop_t *)0x0,(uv_fs_t *)auStack_638,"test/fixtures/one_file",0,
                        (uv_fs_cb)0x0);
  lStack_658 = (long)iVar5;
  if ((long)uStack_648.name < lStack_658) {
    lStack_658 = -0xfff;
    puStack_660 = (uv_fs_t *)0x193565;
    iVar5 = uv_fs_scandir_next((uv_fs_t *)auStack_638,&uStack_648);
    lStack_650 = (long)iVar5;
    if (lStack_658 == lStack_650) goto LAB_0019365a;
    puVar8 = (uv_loop_t *)auStack_638;
    puStack_660 = (uv_fs_t *)0x193588;
    uv_fs_req_cleanup((uv_fs_t *)puVar8);
    lStack_658 = 0;
    puStack_660 = (uv_fs_t *)0x1935a6;
    iVar5 = uv_fs_scandir((uv_loop_t *)0x0,(uv_fs_t *)puVar8,"test/fixtures",0,(uv_fs_cb)0x0);
    lStack_650 = (long)iVar5;
    if (lStack_650 <= lStack_658) goto LAB_00193667;
    lStack_658 = -0xfff;
    puStack_660 = (uv_fs_t *)0x1935d3;
    iVar5 = uv_fs_scandir_next((uv_fs_t *)auStack_638,&uStack_648);
    lStack_650 = (long)iVar5;
    if (lStack_658 == lStack_650) goto LAB_00193674;
    puStack_660 = (uv_fs_t *)0x1935f3;
    uv_fs_req_cleanup((uv_fs_t *)auStack_638);
    puStack_660 = (uv_fs_t *)0x1935f8;
    puVar8 = uv_default_loop();
    puStack_660 = (uv_fs_t *)0x19360c;
    uv_walk(puVar8,close_walk_cb,(void *)0x0);
    puStack_660 = (uv_fs_t *)0x193616;
    uv_run(puVar8,UV_RUN_DEFAULT);
    lStack_658 = 0;
    puStack_660 = (uv_fs_t *)0x193623;
    puVar9 = uv_default_loop();
    puStack_660 = (uv_fs_t *)0x19362b;
    iVar5 = uv_loop_close(puVar9);
    lStack_650 = (long)iVar5;
    if (lStack_658 == lStack_650) {
      puStack_660 = (uv_fs_t *)0x193642;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_660 = (uv_fs_t *)0x19365a;
    run_test_fs_scandir_early_exit_cold_1();
LAB_0019365a:
    puStack_660 = (uv_fs_t *)0x193667;
    run_test_fs_scandir_early_exit_cold_5();
LAB_00193667:
    puStack_660 = (uv_fs_t *)0x193674;
    run_test_fs_scandir_early_exit_cold_2();
LAB_00193674:
    puStack_660 = (uv_fs_t *)0x193681;
    run_test_fs_scandir_early_exit_cold_4();
  }
  puStack_660 = (uv_fs_t *)run_test_fs_open_dir;
  run_test_fs_scandir_early_exit_cold_3();
  puStack_668 = puVar8;
  puStack_660 = puVar14;
  loop = uv_default_loop();
  iVar5 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(auStack_830 + 8),".",0,0,(uv_fs_cb)0x0);
  auStack_830._0_8_ = SEXT48(iVar5);
  if ((void *)auStack_830._0_8_ == (void *)0x0) {
    auStack_830._0_8_ = pvStack_7d0;
    if ((long)pvStack_7d0 < 0) goto LAB_00193852;
    if (pcStack_7c8 != (char *)0x0) goto LAB_00193861;
    puVar14 = (uv_fs_t *)(auStack_830 + 8);
    uv_fs_req_cleanup(puVar14);
    iVar5 = uv_fs_close((uv_loop_t *)0x0,puVar14,(uv_os_fd_t)pvStack_7d0,(uv_fs_cb)0x0);
    auStack_830._0_8_ = SEXT48(iVar5);
    if ((void *)auStack_830._0_8_ != (void *)0x0) goto LAB_00193866;
    iVar5 = uv_fs_open(loop,(uv_fs_t *)(auStack_830 + 8),".",0,0,open_cb_simple);
    auStack_830._0_8_ = SEXT48(iVar5);
    if ((void *)auStack_830._0_8_ != (void *)0x0) goto LAB_00193875;
    auStack_830._0_8_ = SEXT48(open_cb_count);
    if ((void *)auStack_830._0_8_ != (void *)0x0) goto LAB_00193884;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar8 = loop;
    auStack_830._0_8_ = (void *)0x1;
    if (open_cb_count != 1) goto LAB_00193893;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    uv_run(puVar8,UV_RUN_DEFAULT);
    auStack_830._0_8_ = (void *)0x0;
    iVar5 = uv_loop_close(loop);
    if ((void *)auStack_830._0_8_ == (void *)(long)iVar5) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_open_dir_cold_1();
LAB_00193852:
    run_test_fs_open_dir_cold_8();
LAB_00193861:
    run_test_fs_open_dir_cold_2();
LAB_00193866:
    run_test_fs_open_dir_cold_3();
LAB_00193875:
    run_test_fs_open_dir_cold_4();
LAB_00193884:
    run_test_fs_open_dir_cold_5();
LAB_00193893:
    run_test_fs_open_dir_cold_6();
  }
  puVar13 = (uv_fs_t *)auStack_830;
  run_test_fs_open_dir_cold_7();
  if (puVar13->fs_type == UV_FS_OPEN) {
    puVar10 = (uv_fs_t *)puVar13->result;
    if ((long)puVar10 < 0) goto LAB_00193901;
    open_cb_count = open_cb_count + 1;
    puVar10 = puVar13;
    if (puVar13->path != (char *)0x0) {
      uv_fs_req_cleanup(puVar13);
      return extraout_EAX_02;
    }
  }
  else {
    open_cb_simple_cold_1();
    puVar10 = extraout_RAX;
LAB_00193901:
    open_cb_simple_cold_3();
  }
  iVar5 = (int)puVar10;
  open_cb_simple_cold_2();
  fs_file_open_append(iVar5);
  fs_file_open_append(iVar5);
  puVar8 = uv_default_loop();
  uv_walk(puVar8,close_walk_cb,(void *)0x0);
  uv_run(puVar8,UV_RUN_DEFAULT);
  puVar8 = uv_default_loop();
  iVar5 = uv_loop_close(puVar8);
  if (iVar5 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_file_open_append_cold_1();
  pcVar12 = "test_file";
  puStack_8b0 = (uv_fs_t *)0x193998;
  unlink("test_file");
  puStack_8b0 = (uv_fs_t *)0x19399d;
  loop = uv_default_loop();
  puStack_8b0 = (uv_fs_t *)0x1939c3;
  iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  sVar4 = open_req1.result;
  if (iVar5 == 0) {
    pcVar12 = (char *)open_req1.result;
    if (open_req1.result < 0) goto LAB_00193e57;
    puStack_8b0 = (uv_fs_t *)0x193a14;
    uv_fs_req_cleanup(&open_req1);
    puStack_8b0 = (uv_fs_t *)0x193a25;
    iov = uv_buf_init(test_buf,0xd);
    puVar14 = (uv_fs_t *)0x0;
    puStack_8b0 = (uv_fs_t *)0x193a5e;
    iVar5 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_os_fd_t)sVar4,&iov,1,-1,(uv_fs_cb)0x0);
    pcVar12 = (char *)sVar4;
    if (iVar5 < 0) goto LAB_00193e66;
    if (write_req.result < 0) goto LAB_00193e75;
    puStack_8b0 = (uv_fs_t *)0x193aab;
    uv_fs_req_cleanup(&write_req);
    puStack_8b0 = (uv_fs_t *)0x193abd;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)sVar4,(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_00193e84;
    if (close_req.result != 0) goto LAB_00193e93;
    puStack_8b0 = (uv_fs_t *)0x193b0e;
    uv_fs_req_cleanup(&close_req);
    puStack_8b0 = (uv_fs_t *)0x193b2e;
    iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x402,0,(uv_fs_cb)0x0);
    pcVar16 = (char *)open_req1.result;
    if (iVar5 < 0) goto LAB_00193ea2;
    if (open_req1.result < 0) goto LAB_00193eb1;
    puStack_8b0 = (uv_fs_t *)0x193b7f;
    uv_fs_req_cleanup(&open_req1);
    puStack_8b0 = (uv_fs_t *)0x193b90;
    uVar19 = uv_buf_init(test_buf,0xd);
    puVar14 = (uv_fs_t *)0x0;
    puStack_8b0 = (uv_fs_t *)0x193bc9;
    iov = uVar19;
    iVar5 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_os_fd_t)pcVar16,&iov,1,-1,(uv_fs_cb)0x0);
    if (iVar5 < 0) goto LAB_00193ec0;
    if (write_req.result < 0) goto LAB_00193ecf;
    puStack_8b0 = (uv_fs_t *)0x193c16;
    uv_fs_req_cleanup(&write_req);
    puStack_8b0 = (uv_fs_t *)0x193c28;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)pcVar16,(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_00193ede;
    if (close_req.result != 0) goto LAB_00193eed;
    puStack_8b0 = (uv_fs_t *)0x193c79;
    uv_fs_req_cleanup(&close_req);
    puStack_8b0 = (uv_fs_t *)0x193c99;
    iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0x100,(uv_fs_cb)0x0);
    pcVar12 = (char *)open_req1.result;
    if (iVar5 != 0) goto LAB_00193efc;
    if (open_req1.result < 0) goto LAB_00193f0b;
    puStack_8b0 = (uv_fs_t *)0x193cea;
    uv_fs_req_cleanup(&open_req1);
    puStack_8b0 = (uv_fs_t *)0x193cfb;
    uVar19 = uv_buf_init(buf,0x20);
    puStack_8b0 = (uv_fs_t *)0x193d35;
    iov = uVar19;
    uVar6 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_os_fd_t)pcVar12,&iov,1,-1,(uv_fs_cb)0x0);
    puStack_8b0 = (uv_fs_t *)0x193d47;
    printf("read = %d\n",(ulong)uVar6);
    if (uVar6 != 0x1a) goto LAB_00193f1a;
    if (read_req.result != 0x1a) goto LAB_00193f29;
    puStack_8b0 = (uv_fs_t *)0x193da5;
    iVar5 = memcmp(buf,"test-buffer\n",0x1a);
    if (iVar5 != 0) goto LAB_00193f38;
    puStack_8b0 = (uv_fs_t *)0x193dd1;
    uv_fs_req_cleanup(&read_req);
    puStack_8b0 = (uv_fs_t *)0x193de3;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)pcVar12,(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_00193f47;
    if (close_req.result == 0) {
      puStack_8b0 = (uv_fs_t *)0x193e34;
      uv_fs_req_cleanup(&close_req);
      iVar5 = unlink("test_file");
      return iVar5;
    }
  }
  else {
    puStack_8b0 = (uv_fs_t *)0x193e57;
    fs_file_open_append_cold_1();
LAB_00193e57:
    puStack_8b0 = (uv_fs_t *)0x193e66;
    fs_file_open_append_cold_19();
LAB_00193e66:
    puStack_8b0 = (uv_fs_t *)0x193e75;
    fs_file_open_append_cold_18();
LAB_00193e75:
    puStack_8b0 = (uv_fs_t *)0x193e84;
    fs_file_open_append_cold_17();
LAB_00193e84:
    puStack_8b0 = (uv_fs_t *)0x193e93;
    fs_file_open_append_cold_2();
LAB_00193e93:
    puStack_8b0 = (uv_fs_t *)0x193ea2;
    fs_file_open_append_cold_3();
LAB_00193ea2:
    pcVar16 = pcVar12;
    puStack_8b0 = (uv_fs_t *)0x193eb1;
    fs_file_open_append_cold_16();
LAB_00193eb1:
    puStack_8b0 = (uv_fs_t *)0x193ec0;
    fs_file_open_append_cold_15();
LAB_00193ec0:
    puStack_8b0 = (uv_fs_t *)0x193ecf;
    fs_file_open_append_cold_14();
LAB_00193ecf:
    puStack_8b0 = (uv_fs_t *)0x193ede;
    fs_file_open_append_cold_13();
LAB_00193ede:
    puStack_8b0 = (uv_fs_t *)0x193eed;
    fs_file_open_append_cold_4();
LAB_00193eed:
    puStack_8b0 = (uv_fs_t *)0x193efc;
    fs_file_open_append_cold_5();
LAB_00193efc:
    pcVar12 = pcVar16;
    puStack_8b0 = (uv_fs_t *)0x193f0b;
    fs_file_open_append_cold_6();
LAB_00193f0b:
    puStack_8b0 = (uv_fs_t *)0x193f1a;
    fs_file_open_append_cold_12();
LAB_00193f1a:
    puStack_8b0 = (uv_fs_t *)0x193f29;
    fs_file_open_append_cold_7();
LAB_00193f29:
    puStack_8b0 = (uv_fs_t *)0x193f38;
    fs_file_open_append_cold_8();
LAB_00193f38:
    puStack_8b0 = (uv_fs_t *)0x193f47;
    fs_file_open_append_cold_9();
LAB_00193f47:
    puStack_8b0 = (uv_fs_t *)0x193f56;
    fs_file_open_append_cold_10();
  }
  puStack_8b0 = (uv_fs_t *)run_test_fs_rename_to_existing_file;
  fs_file_open_append_cold_11();
  pcStack_8b8 = pcVar12;
  puStack_8b0 = puVar14;
  unlink("test_file");
  unlink("test_file2");
  loop = uv_default_loop();
  iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  sVar4 = open_req1.result;
  lStack_8c0 = (long)iVar5;
  if (lStack_8c0 == 0) {
    lStack_8c0 = open_req1.result;
    if (open_req1.result < 0) goto LAB_00194474;
    uv_fs_req_cleanup(&open_req1);
    uVar19 = uv_buf_init(test_buf,0xd);
    puVar14 = (uv_fs_t *)0x0;
    iov = uVar19;
    iVar5 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_os_fd_t)sVar4,&iov,1,-1,(uv_fs_cb)0x0);
    lStack_8c0 = (long)iVar5;
    if (lStack_8c0 < 0) goto LAB_00194483;
    lStack_8c0 = write_req.result;
    if (write_req.result < 0) goto LAB_00194492;
    uv_fs_req_cleanup(&write_req);
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)sVar4,(uv_fs_cb)0x0);
    lStack_8c0 = (long)iVar5;
    if (lStack_8c0 != 0) goto LAB_001944a1;
    lStack_8c0 = close_req.result;
    if (close_req.result != 0) goto LAB_001944b0;
    uv_fs_req_cleanup(&close_req);
    iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0x41,0x180,(uv_fs_cb)0x0);
    sVar4 = open_req1.result;
    lStack_8c0 = (long)iVar5;
    if (lStack_8c0 != 0) goto LAB_001944bf;
    lStack_8c0 = open_req1.result;
    if (open_req1.result < 0) goto LAB_001944ce;
    uv_fs_req_cleanup(&open_req1);
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)sVar4,(uv_fs_cb)0x0);
    lStack_8c0 = (long)iVar5;
    if (lStack_8c0 != 0) goto LAB_001944dd;
    lStack_8c0 = close_req.result;
    if (close_req.result != 0) goto LAB_001944ec;
    uv_fs_req_cleanup(&close_req);
    iVar5 = uv_fs_rename((uv_loop_t *)0x0,&rename_req,"test_file","test_file2",(uv_fs_cb)0x0);
    lStack_8c0 = (long)iVar5;
    if (lStack_8c0 != 0) goto LAB_001944fb;
    lStack_8c0 = rename_req.result;
    if (rename_req.result != 0) goto LAB_0019450a;
    uv_fs_req_cleanup(&rename_req);
    iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0,0,(uv_fs_cb)0x0);
    sVar4 = open_req1.result;
    lStack_8c0 = (long)iVar5;
    if (lStack_8c0 != 0) goto LAB_00194519;
    lStack_8c0 = open_req1.result;
    if (open_req1.result < 0) goto LAB_00194528;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar19 = uv_buf_init(buf,0x20);
    puVar14 = (uv_fs_t *)0x0;
    iov = uVar19;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_os_fd_t)sVar4,&iov,1,-1,(uv_fs_cb)0x0);
    lStack_8c0 = (long)iVar5;
    if (lStack_8c0 < 0) goto LAB_00194537;
    lStack_8c0 = read_req.result;
    if (read_req.result < 0) goto LAB_00194546;
    iVar5 = strcmp(buf,test_buf);
    lStack_8c0 = (long)iVar5;
    if (lStack_8c0 != 0) goto LAB_00194555;
    uv_fs_req_cleanup(&read_req);
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)sVar4,(uv_fs_cb)0x0);
    lStack_8c0 = (long)iVar5;
    if (lStack_8c0 != 0) goto LAB_00194564;
    lStack_8c0 = close_req.result;
    if (close_req.result != 0) goto LAB_00194573;
    uv_fs_req_cleanup(&close_req);
    unlink("test_file");
    unlink("test_file2");
    puVar8 = loop;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    uv_run(puVar8,UV_RUN_DEFAULT);
    lStack_8c0 = 0;
    iVar5 = uv_loop_close(loop);
    if (lStack_8c0 == iVar5) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_rename_to_existing_file_cold_1();
LAB_00194474:
    run_test_fs_rename_to_existing_file_cold_20();
LAB_00194483:
    run_test_fs_rename_to_existing_file_cold_19();
LAB_00194492:
    run_test_fs_rename_to_existing_file_cold_18();
LAB_001944a1:
    run_test_fs_rename_to_existing_file_cold_2();
LAB_001944b0:
    run_test_fs_rename_to_existing_file_cold_3();
LAB_001944bf:
    run_test_fs_rename_to_existing_file_cold_4();
LAB_001944ce:
    run_test_fs_rename_to_existing_file_cold_17();
LAB_001944dd:
    run_test_fs_rename_to_existing_file_cold_5();
LAB_001944ec:
    run_test_fs_rename_to_existing_file_cold_6();
LAB_001944fb:
    run_test_fs_rename_to_existing_file_cold_7();
LAB_0019450a:
    run_test_fs_rename_to_existing_file_cold_8();
LAB_00194519:
    run_test_fs_rename_to_existing_file_cold_9();
LAB_00194528:
    run_test_fs_rename_to_existing_file_cold_16();
LAB_00194537:
    run_test_fs_rename_to_existing_file_cold_15();
LAB_00194546:
    run_test_fs_rename_to_existing_file_cold_14();
LAB_00194555:
    run_test_fs_rename_to_existing_file_cold_10();
LAB_00194564:
    run_test_fs_rename_to_existing_file_cold_11();
LAB_00194573:
    run_test_fs_rename_to_existing_file_cold_12();
  }
  iVar5 = (int)&lStack_8c0;
  run_test_fs_rename_to_existing_file_cold_13();
  fs_read_bufs(iVar5);
  fs_read_bufs(iVar5);
  puVar8 = uv_default_loop();
  uv_walk(puVar8,close_walk_cb,(void *)0x0);
  uv_run(puVar8,UV_RUN_DEFAULT);
  puVar9 = uv_default_loop();
  iVar5 = uv_loop_close(puVar9);
  if (iVar5 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_read_bufs_cold_1();
  puStack_c68 = (uv_loop_t *)0x19462d;
  puStack_900 = puVar8;
  puStack_8f8 = puVar14;
  iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,(uv_fs_cb)0x0);
  uVar3 = auStack_c40._8_8_;
  sVar4 = open_req1.result;
  apcStack_c00[0] = (char *)(long)iVar5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = auStack_c40._8_8_;
  auStack_c40 = auVar1 << 0x40;
  if (apcStack_c00[0] == (char *)0x0) {
    apcStack_c00[0] = (char *)open_req1.result;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    auStack_c40 = auVar2 << 0x40;
    puVar8 = (uv_loop_t *)open_req1.result;
    if (open_req1.result < 0) goto LAB_0019498a;
    puStack_c68 = (uv_loop_t *)0x19467e;
    uv_fs_req_cleanup(&open_req1);
    apcStack_c00[0] = (char *)0xffffffffffffffea;
    uVar11 = (uv_os_fd_t)sVar4;
    puStack_c68 = (uv_loop_t *)0x1946a7;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,uVar11,(uv_buf_t *)0x0,0,0,(uv_fs_cb)0x0);
    auStack_c40._0_8_ = (char *)(long)iVar5;
    puVar8 = (uv_loop_t *)sVar4;
    if (apcStack_c00[0] != (char *)(long)iVar5) goto LAB_00194999;
    apcStack_c00[0] = (char *)0xffffffffffffffea;
    puStack_c68 = (uv_loop_t *)0x1946ea;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,uVar11,(uv_buf_t *)0x0,1,0,(uv_fs_cb)0x0);
    auStack_c40._0_8_ = (char *)(long)iVar5;
    if (apcStack_c00[0] != (char *)(long)iVar5) goto LAB_001949a8;
    apcStack_c00[0] = (char *)0xffffffffffffffea;
    puStack_c68 = (uv_loop_t *)0x19472d;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,uVar11,(uv_buf_t *)auStack_c40,0,0,(uv_fs_cb)0x0);
    pcStack_c50 = (char *)(long)iVar5;
    if (apcStack_c00[0] != pcStack_c50) goto LAB_001949b7;
    puStack_c68 = (uv_loop_t *)0x194753;
    auStack_c40 = (undefined1  [16])uv_buf_init((char *)apcStack_c00,0x100);
    puVar14 = (uv_fs_t *)auStack_c40;
    puStack_c68 = (uv_loop_t *)0x194771;
    uStack_c30 = uv_buf_init(acStack_b00,0x100);
    puStack_c68 = (uv_loop_t *)0x19478b;
    uStack_c20 = uv_buf_init(acStack_a00,0x80);
    puStack_c68 = (uv_loop_t *)0x1947a5;
    uStack_c10 = uv_buf_init(acStack_980,0x80);
    pcStack_c50 = (char *)0x1be;
    puStack_c68 = (uv_loop_t *)0x1947da;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,uVar11,(uv_buf_t *)puVar14,2,0,(uv_fs_cb)0x0);
    pcStack_c48 = (char *)(long)iVar5;
    if (pcStack_c50 != pcStack_c48) goto LAB_001949c6;
    pcStack_c50 = (char *)0x1be;
    pcStack_c48 = (char *)read_req.result;
    if (read_req.result != 0x1be) goto LAB_001949d5;
    puVar14 = (uv_fs_t *)&uStack_c20;
    unaff_R15 = &read_req;
    puStack_c68 = (uv_loop_t *)0x19482a;
    uv_fs_req_cleanup(&read_req);
    pcStack_c50 = (char *)0xbe;
    puStack_c68 = (uv_loop_t *)0x194856;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,uVar11,(uv_buf_t *)puVar14,2,0x100,(uv_fs_cb)0x0);
    pcStack_c48 = (char *)(long)iVar5;
    if (pcStack_c50 != pcStack_c48) goto LAB_001949e4;
    pcStack_c50 = (char *)read_req.result;
    pcStack_c48 = (char *)0xbe;
    if (read_req.result != 0xbe) goto LAB_001949f3;
    puStack_c68 = (uv_loop_t *)0x19489e;
    uv_fs_req_cleanup(&read_req);
    puVar14 = (uv_fs_t *)uStack_c30.base;
    puStack_c68 = (uv_loop_t *)0x1948b5;
    iVar5 = memcmp(uStack_c30.base,uStack_c20.base,0x80);
    pcStack_c50 = (char *)(long)iVar5;
    pcStack_c48 = (char *)0x0;
    if (pcStack_c50 != (char *)0x0) goto LAB_00194a02;
    puVar14 = (uv_fs_t *)&((uv_stat_t *)((long)puVar14 + 0x70))->st_nlink;
    puStack_c68 = (uv_loop_t *)0x1948eb;
    iVar5 = memcmp(puVar14,uStack_c10.base,0x3e);
    pcStack_c50 = (char *)(long)iVar5;
    pcStack_c48 = (char *)0x0;
    if (pcStack_c50 != (char *)0x0) goto LAB_00194a11;
    puStack_c68 = (uv_loop_t *)0x19491d;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,uVar11,(uv_fs_cb)0x0);
    pcStack_c50 = (char *)(long)iVar5;
    pcStack_c48 = (char *)0x0;
    if (pcStack_c50 != (char *)0x0) goto LAB_00194a20;
    pcStack_c50 = (char *)close_req.result;
    pcStack_c48 = (char *)0x0;
    if (close_req.result == 0) {
      puStack_c68 = (uv_loop_t *)0x19496e;
      uv_fs_req_cleanup(&close_req);
      return extraout_EAX_03;
    }
  }
  else {
    puStack_c68 = (uv_loop_t *)0x19498a;
    fs_read_bufs_cold_1();
LAB_0019498a:
    puStack_c68 = (uv_loop_t *)0x194999;
    fs_read_bufs_cold_13();
LAB_00194999:
    puStack_c68 = (uv_loop_t *)0x1949a8;
    fs_read_bufs_cold_2();
LAB_001949a8:
    puStack_c68 = (uv_loop_t *)0x1949b7;
    fs_read_bufs_cold_3();
LAB_001949b7:
    puStack_c68 = (uv_loop_t *)0x1949c6;
    fs_read_bufs_cold_4();
LAB_001949c6:
    puStack_c68 = (uv_loop_t *)0x1949d5;
    fs_read_bufs_cold_5();
LAB_001949d5:
    puStack_c68 = (uv_loop_t *)0x1949e4;
    fs_read_bufs_cold_6();
LAB_001949e4:
    puStack_c68 = (uv_loop_t *)0x1949f3;
    fs_read_bufs_cold_7();
LAB_001949f3:
    puStack_c68 = (uv_loop_t *)0x194a02;
    fs_read_bufs_cold_8();
LAB_00194a02:
    puStack_c68 = (uv_loop_t *)0x194a11;
    fs_read_bufs_cold_9();
LAB_00194a11:
    puStack_c68 = (uv_loop_t *)0x194a20;
    fs_read_bufs_cold_10();
LAB_00194a20:
    puStack_c68 = (uv_loop_t *)0x194a2f;
    fs_read_bufs_cold_11();
  }
  iVar5 = (int)&pcStack_c50;
  puStack_c68 = (uv_loop_t *)run_test_fs_read_file_eof;
  fs_read_bufs_cold_12();
  puStack_c80 = (uv_fs_t *)0x194a48;
  puStack_c68 = puVar8;
  fs_read_file_eof(iVar5);
  puStack_c80 = (uv_fs_t *)0x194a4d;
  fs_read_file_eof(iVar5);
  puStack_c80 = (uv_fs_t *)0x194a52;
  puVar8 = uv_default_loop();
  puStack_c80 = (uv_fs_t *)0x194a66;
  uv_walk(puVar8,close_walk_cb,(void *)0x0);
  puStack_c80 = (uv_fs_t *)0x194a70;
  uv_run(puVar8,UV_RUN_DEFAULT);
  lStack_c70 = 0;
  puStack_c80 = (uv_fs_t *)0x194a7e;
  puVar9 = uv_default_loop();
  puStack_c80 = (uv_fs_t *)0x194a86;
  iVar5 = uv_loop_close(puVar9);
  lStack_c78 = (long)iVar5;
  if (lStack_c70 == lStack_c78) {
    puStack_c80 = (uv_fs_t *)0x194a9c;
    uv_library_shutdown();
    return 0;
  }
  puStack_c80 = (uv_fs_t *)fs_read_file_eof;
  run_test_fs_read_file_eof_cold_1();
  puStack_c90 = puVar8;
  puStack_c88 = puVar14;
  puStack_c80 = unaff_R15;
  unlink("test_file");
  loop = uv_default_loop();
  iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  sVar4 = open_req1.result;
  sStack_c98 = (ssize_t)iVar5;
  if (sStack_c98 == 0) {
    sStack_c98 = open_req1.result;
    if (open_req1.result < 0) goto LAB_00194ea5;
    uv_fs_req_cleanup(&open_req1);
    uVar19 = uv_buf_init(test_buf,0xd);
    iov = uVar19;
    iVar5 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_os_fd_t)sVar4,&iov,1,-1,(uv_fs_cb)0x0);
    sStack_c98 = (ssize_t)iVar5;
    if (sStack_c98 < 0) goto LAB_00194eb4;
    sStack_c98 = write_req.result;
    if (write_req.result < 0) goto LAB_00194ec3;
    uv_fs_req_cleanup(&write_req);
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)sVar4,(uv_fs_cb)0x0);
    sStack_c98 = (ssize_t)iVar5;
    if (sStack_c98 != 0) goto LAB_00194ed2;
    sStack_c98 = close_req.result;
    if (close_req.result != 0) goto LAB_00194ee1;
    uv_fs_req_cleanup(&close_req);
    iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    sVar4 = open_req1.result;
    sStack_c98 = (ssize_t)iVar5;
    if (sStack_c98 != 0) goto LAB_00194ef0;
    sStack_c98 = open_req1.result;
    if (open_req1.result < 0) goto LAB_00194eff;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar19 = uv_buf_init(buf,0x20);
    iov = uVar19;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_os_fd_t)sVar4,&iov,1,-1,(uv_fs_cb)0x0);
    sVar4 = open_req1.result;
    sStack_c98 = (ssize_t)iVar5;
    if (sStack_c98 < 0) goto LAB_00194f0e;
    sStack_c98 = open_req1.result;
    if (open_req1.result < 0) goto LAB_00194f1d;
    iVar5 = strcmp(buf,test_buf);
    sStack_c98 = (ssize_t)iVar5;
    if (sStack_c98 != 0) goto LAB_00194f2c;
    uv_fs_req_cleanup(&read_req);
    uVar19 = uv_buf_init(buf,0x20);
    iov = uVar19;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_os_fd_t)sVar4,&iov,1,read_req.result,
                       (uv_fs_cb)0x0);
    sStack_c98 = (ssize_t)iVar5;
    if (sStack_c98 != 0) goto LAB_00194f3b;
    sStack_c98 = read_req.result;
    if (read_req.result != 0) goto LAB_00194f4a;
    uv_fs_req_cleanup(&read_req);
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)sVar4,(uv_fs_cb)0x0);
    sStack_c98 = (ssize_t)iVar5;
    if (sStack_c98 != 0) goto LAB_00194f59;
    sStack_c98 = close_req.result;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      iVar5 = unlink("test_file");
      return iVar5;
    }
  }
  else {
    fs_read_file_eof_cold_1();
LAB_00194ea5:
    fs_read_file_eof_cold_15();
LAB_00194eb4:
    fs_read_file_eof_cold_14();
LAB_00194ec3:
    fs_read_file_eof_cold_13();
LAB_00194ed2:
    fs_read_file_eof_cold_2();
LAB_00194ee1:
    fs_read_file_eof_cold_3();
LAB_00194ef0:
    fs_read_file_eof_cold_4();
LAB_00194eff:
    fs_read_file_eof_cold_12();
LAB_00194f0e:
    fs_read_file_eof_cold_11();
LAB_00194f1d:
    fs_read_file_eof_cold_10();
LAB_00194f2c:
    fs_read_file_eof_cold_5();
LAB_00194f3b:
    fs_read_file_eof_cold_6();
LAB_00194f4a:
    fs_read_file_eof_cold_7();
LAB_00194f59:
    fs_read_file_eof_cold_8();
  }
  iVar5 = (int)&sStack_c98;
  fs_read_file_eof_cold_9();
  fs_write_multiple_bufs(iVar5);
  fs_write_multiple_bufs(iVar5);
  puVar8 = uv_default_loop();
  uv_walk(puVar8,close_walk_cb,(void *)0x0);
  uv_run(puVar8,UV_RUN_DEFAULT);
  puVar9 = uv_default_loop();
  iVar5 = uv_loop_close(puVar9);
  if (iVar5 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_write_multiple_bufs_cold_1();
  puStack_ce8 = puVar8;
  unlink("test_file");
  loop = uv_default_loop();
  iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  sVar4 = open_req1.result;
  uStack_d10.base = (char *)(long)iVar5;
  asStack_d20[0] = 0;
  if ((char *)(long)iVar5 == (char *)0x0) {
    uStack_d10.base = (char *)open_req1.result;
    asStack_d20[0] = 0;
    if (open_req1.result < 0) goto LAB_001956a4;
    uv_fs_req_cleanup(&open_req1);
    uStack_d10 = uv_buf_init(test_buf,0xd);
    uStack_d00 = uv_buf_init(test_buf2,0xf);
    iVar5 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_os_fd_t)sVar4,&uStack_d10,2,0,(uv_fs_cb)0x0)
    ;
    asStack_d20[0] = (ssize_t)iVar5;
    asStack_d20[1] = 0;
    if (asStack_d20[0] < 0) goto LAB_001956b3;
    asStack_d20[0] = write_req.result;
    asStack_d20[1] = 0;
    if (write_req.result < 0) goto LAB_001956c2;
    uv_fs_req_cleanup(&write_req);
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)sVar4,(uv_fs_cb)0x0);
    asStack_d20[0] = (ssize_t)iVar5;
    asStack_d20[1] = 0;
    if (asStack_d20[0] != 0) goto LAB_001956d1;
    asStack_d20[0] = close_req.result;
    asStack_d20[1] = 0;
    if (close_req.result != 0) goto LAB_001956e0;
    uv_fs_req_cleanup(&close_req);
    iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    sVar4 = open_req1.result;
    asStack_d20[0] = (ssize_t)iVar5;
    asStack_d20[1] = 0;
    if (asStack_d20[0] != 0) goto LAB_001956ef;
    asStack_d20[0] = open_req1.result;
    asStack_d20[1] = 0;
    if (open_req1.result < 0) goto LAB_001956fe;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    uStack_d10 = uv_buf_init(buf,0xd);
    uStack_d00 = uv_buf_init(buf2,0xf);
    iVar5 = (int)sVar4;
    asStack_d20[0] = lseek64(iVar5,0,1);
    asStack_d20[1] = 0;
    if (asStack_d20[0] != 0) goto LAB_0019570d;
    iVar7 = uv_fs_read((uv_loop_t *)0x0,&read_req,iVar5,&uStack_d10,2,-1,(uv_fs_cb)0x0);
    asStack_d20[0] = (ssize_t)iVar7;
    asStack_d20[1] = 0;
    if (asStack_d20[0] < 0) goto LAB_0019571c;
    asStack_d20[0] = read_req.result;
    asStack_d20[1] = 0x1c;
    if (read_req.result != 0x1c) goto LAB_0019572b;
    iVar7 = strcmp(buf,test_buf);
    asStack_d20[0] = (ssize_t)iVar7;
    asStack_d20[1] = 0;
    if (asStack_d20[0] != 0) goto LAB_0019573a;
    iVar7 = strcmp(buf2,test_buf2);
    asStack_d20[0] = (ssize_t)iVar7;
    asStack_d20[1] = 0;
    if (asStack_d20[0] != 0) goto LAB_00195749;
    uv_fs_req_cleanup(&read_req);
    uVar19 = uv_buf_init(buf,0x20);
    iov = uVar19;
    iVar7 = uv_fs_read((uv_loop_t *)0x0,&read_req,iVar5,&iov,1,-1,(uv_fs_cb)0x0);
    asStack_d20[0] = (ssize_t)iVar7;
    asStack_d20[1] = 0;
    if (asStack_d20[0] != 0) goto LAB_00195758;
    asStack_d20[0] = read_req.result;
    asStack_d20[1] = 0;
    if (read_req.result != 0) goto LAB_00195767;
    uv_fs_req_cleanup(&read_req);
    uStack_d10 = uv_buf_init(buf,0xd);
    uStack_d00 = uv_buf_init(buf2,0xf);
    unaff_R12 = 0;
    iVar7 = uv_fs_read((uv_loop_t *)0x0,&read_req,iVar5,&uStack_d10,2,0,(uv_fs_cb)0x0);
    asStack_d20[0] = (ssize_t)iVar7;
    asStack_d20[1] = 0;
    if (asStack_d20[0] < 0) goto LAB_00195776;
    lVar15 = read_req.result;
    if (read_req.result == 0xd) {
      uv_fs_req_cleanup(&read_req);
      unaff_R12 = 0;
      iVar7 = uv_fs_read((uv_loop_t *)0x0,&read_req,iVar5,&uStack_d00,1,read_req.result,
                         (uv_fs_cb)0x0);
      asStack_d20[0] = (ssize_t)iVar7;
      asStack_d20[1] = 0;
      if (-1 < asStack_d20[0]) {
        asStack_d20[0] = read_req.result;
        asStack_d20[1] = 0xf;
        if (read_req.result != 0xf) {
          fs_write_multiple_bufs_cold_12();
          lVar15 = extraout_RAX_00;
          goto LAB_001954f5;
        }
        goto LAB_00195513;
      }
      goto LAB_001957df;
    }
LAB_001954f5:
    unaff_R12 = 0;
    asStack_d20[1] = 0x1c;
    asStack_d20[0] = lVar15;
    if (lVar15 == 0x1c) {
LAB_00195513:
      unaff_R12 = 0;
      iVar7 = strcmp(buf,test_buf);
      asStack_d20[0] = (ssize_t)iVar7;
      asStack_d20[1] = 0;
      if (asStack_d20[0] != 0) goto LAB_00195785;
      iVar7 = strcmp(buf2,test_buf2);
      asStack_d20[0] = (ssize_t)iVar7;
      asStack_d20[1] = 0;
      if (asStack_d20[0] != 0) goto LAB_00195794;
      uv_fs_req_cleanup(&read_req);
      uVar19 = uv_buf_init(buf,0x20);
      iov = uVar19;
      iVar7 = uv_fs_read((uv_loop_t *)0x0,&read_req,iVar5,&iov,1,0x1c,(uv_fs_cb)0x0);
      asStack_d20[0] = (ssize_t)iVar7;
      asStack_d20[1] = 0;
      if (asStack_d20[0] != 0) goto LAB_001957a3;
      asStack_d20[0] = read_req.result;
      asStack_d20[1] = 0;
      if (read_req.result != 0) goto LAB_001957b2;
      uv_fs_req_cleanup(&read_req);
      iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,iVar5,(uv_fs_cb)0x0);
      asStack_d20[0] = (ssize_t)iVar5;
      asStack_d20[1] = 0;
      if (asStack_d20[0] != 0) goto LAB_001957c1;
      asStack_d20[0] = close_req.result;
      asStack_d20[1] = 0;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        iVar5 = unlink("test_file");
        return iVar5;
      }
      goto LAB_001957d0;
    }
  }
  else {
    fs_write_multiple_bufs_cold_1();
LAB_001956a4:
    fs_write_multiple_bufs_cold_25();
LAB_001956b3:
    fs_write_multiple_bufs_cold_24();
LAB_001956c2:
    fs_write_multiple_bufs_cold_23();
LAB_001956d1:
    fs_write_multiple_bufs_cold_2();
LAB_001956e0:
    fs_write_multiple_bufs_cold_3();
LAB_001956ef:
    fs_write_multiple_bufs_cold_4();
LAB_001956fe:
    fs_write_multiple_bufs_cold_22();
LAB_0019570d:
    fs_write_multiple_bufs_cold_5();
LAB_0019571c:
    fs_write_multiple_bufs_cold_21();
LAB_0019572b:
    fs_write_multiple_bufs_cold_6();
LAB_0019573a:
    fs_write_multiple_bufs_cold_7();
LAB_00195749:
    fs_write_multiple_bufs_cold_8();
LAB_00195758:
    fs_write_multiple_bufs_cold_9();
LAB_00195767:
    fs_write_multiple_bufs_cold_10();
LAB_00195776:
    fs_write_multiple_bufs_cold_20();
LAB_00195785:
    fs_write_multiple_bufs_cold_13();
LAB_00195794:
    fs_write_multiple_bufs_cold_14();
LAB_001957a3:
    fs_write_multiple_bufs_cold_15();
LAB_001957b2:
    fs_write_multiple_bufs_cold_16();
LAB_001957c1:
    fs_write_multiple_bufs_cold_17();
LAB_001957d0:
    fs_write_multiple_bufs_cold_18();
LAB_001957df:
    fs_write_multiple_bufs_cold_19();
  }
  iVar5 = (int)asStack_d20;
  fs_write_multiple_bufs_cold_11();
  fs_write_alotof_bufs(iVar5);
  fs_write_alotof_bufs(iVar5);
  puVar8 = uv_default_loop();
  uv_walk(puVar8,close_walk_cb,(void *)0x0);
  uv_run(puVar8,UV_RUN_DEFAULT);
  puVar9 = uv_default_loop();
  iVar5 = uv_loop_close(puVar9);
  if (iVar5 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  puStack_d70 = puVar8;
  uStack_d68 = unaff_R12;
  unlink("test_file");
  loop = uv_default_loop();
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
LAB_00195cff:
    fs_write_alotof_bufs_cold_18();
LAB_00195d04:
    fs_write_alotof_bufs_cold_1();
LAB_00195d13:
    fs_write_alotof_bufs_cold_17();
LAB_00195d22:
    fs_write_alotof_bufs_cold_16();
LAB_00195d31:
    fs_write_alotof_bufs_cold_2();
LAB_00195d40:
    fs_write_alotof_bufs_cold_15();
LAB_00195d45:
    fs_write_alotof_bufs_cold_3();
LAB_00195d54:
    fs_write_alotof_bufs_cold_4();
LAB_00195d63:
    fs_write_alotof_bufs_cold_5();
LAB_00195d72:
    fs_write_alotof_bufs_cold_14();
LAB_00195d81:
    fs_write_alotof_bufs_cold_13();
LAB_00195d90:
    fs_write_alotof_bufs_cold_6();
LAB_00195d9f:
    fs_write_alotof_bufs_cold_8();
LAB_00195dae:
    fs_write_alotof_bufs_cold_9();
LAB_00195dbd:
    fs_write_alotof_bufs_cold_10();
LAB_00195dcc:
    fs_write_alotof_bufs_cold_11();
  }
  else {
    iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    sVar4 = open_req1.result;
    sStack_d78 = (ssize_t)iVar5;
    if (sStack_d78 != 0) goto LAB_00195d04;
    sStack_d78 = open_req1.result;
    if (open_req1.result < 0) goto LAB_00195d13;
    uv_fs_req_cleanup(&open_req1);
    lVar15 = 8;
    do {
      uVar19 = uv_buf_init(test_buf,0xd);
      *(char **)((long)bufs + lVar15 + -8) = uVar19.base;
      *(size_t *)((long)&bufs->base + lVar15) = uVar19.len;
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0xd4318);
    iVar5 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_os_fd_t)sVar4,bufs,0xd431,-1,(uv_fs_cb)0x0);
    sStack_d78 = (ssize_t)iVar5;
    if (sStack_d78 < 0) goto LAB_00195d22;
    sStack_d78 = write_req.result;
    if (write_req.result != 0xac67d) goto LAB_00195d31;
    uv_fs_req_cleanup(&write_req);
    pcVar12 = (char *)malloc(0xac67d);
    if (pcVar12 == (char *)0x0) goto LAB_00195d40;
    lVar15 = 8;
    pcVar16 = pcVar12;
    do {
      uVar19 = uv_buf_init(pcVar16,0xd);
      *(char **)((long)bufs + lVar15 + -8) = uVar19.base;
      *(size_t *)((long)&bufs->base + lVar15) = uVar19.len;
      lVar15 = lVar15 + 0x10;
      pcVar16 = pcVar16 + 0xd;
    } while (lVar15 != 0xd4318);
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)sVar4,(uv_fs_cb)0x0);
    sStack_d78 = (ssize_t)iVar5;
    if (sStack_d78 != 0) goto LAB_00195d45;
    sStack_d78 = close_req.result;
    if (close_req.result != 0) goto LAB_00195d54;
    uv_fs_req_cleanup(&close_req);
    iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    sVar4 = open_req1.result;
    sStack_d78 = (ssize_t)iVar5;
    if (sStack_d78 != 0) goto LAB_00195d63;
    sStack_d78 = open_req1.result;
    if (open_req1.result < 0) goto LAB_00195d72;
    uv_fs_req_cleanup(&open_req1);
    uVar11 = (uv_os_fd_t)sVar4;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,uVar11,bufs,0xd431,-1,(uv_fs_cb)0x0);
    sStack_d78 = (ssize_t)iVar5;
    if (sStack_d78 < 0) goto LAB_00195d81;
    sStack_d78 = read_req.result;
    if (read_req.result != 0x3400) goto LAB_00195d90;
    lVar15 = 0;
    sVar4 = sStack_d78;
    do {
      sStack_d78 = sVar4;
      iVar5 = strncmp(pcVar12 + lVar15,test_buf,0xd);
      sStack_d78 = (ssize_t)iVar5;
      if (sStack_d78 != 0) {
        fs_write_alotof_bufs_cold_7();
        goto LAB_00195cff;
      }
      lVar15 = lVar15 + 0xd;
      sVar4 = 0;
    } while (lVar15 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pcVar12);
    sStack_d78 = lseek64(uVar11,write_req.result,0);
    if (sStack_d78 != write_req.result) goto LAB_00195d9f;
    uVar19 = uv_buf_init(buf,0x20);
    iov = uVar19;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,uVar11,&iov,1,-1,(uv_fs_cb)0x0);
    sStack_d78 = (ssize_t)iVar5;
    if (sStack_d78 != 0) goto LAB_00195dae;
    sStack_d78 = read_req.result;
    if (read_req.result != 0) goto LAB_00195dbd;
    uv_fs_req_cleanup(&read_req);
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,uVar11,(uv_fs_cb)0x0);
    sStack_d78 = (ssize_t)iVar5;
    if (sStack_d78 != 0) goto LAB_00195dcc;
    sStack_d78 = close_req.result;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(bufs);
      return extraout_EAX_04;
    }
  }
  iVar5 = (int)&sStack_d78;
  fs_write_alotof_bufs_cold_12();
  fs_write_alotof_bufs_with_offset(iVar5);
  fs_write_alotof_bufs_with_offset(iVar5);
  puVar8 = uv_default_loop();
  uv_walk(puVar8,close_walk_cb,(void *)0x0);
  uv_run(puVar8,UV_RUN_DEFAULT);
  puVar9 = uv_default_loop();
  iVar5 = uv_loop_close(puVar9);
  if (iVar5 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  puStack_e08 = (uv_loop_t *)0x195e77;
  unlink("test_file");
  puStack_e08 = (uv_loop_t *)0x195e7c;
  loop = uv_default_loop();
  puStack_e08 = (uv_loop_t *)0x195e8d;
  puVar9 = (uv_loop_t *)malloc(0xd4310);
  if (puVar9 == (uv_loop_t *)0x0) {
LAB_00196326:
    puVar9 = puVar8;
    puStack_e08 = (uv_loop_t *)0x19632b;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_0019632b:
    puStack_e08 = (uv_loop_t *)0x19633a;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_0019633a:
    puStack_e08 = (uv_loop_t *)0x196349;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00196349:
    puStack_e08 = (uv_loop_t *)0x196358;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_00196358:
    puStack_e08 = (uv_loop_t *)0x196367;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00196367:
    puStack_e08 = (uv_loop_t *)0x196376;
    fs_write_alotof_bufs_with_offset_cold_15();
LAB_00196376:
    puStack_e08 = (uv_loop_t *)0x196385;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00196385:
    puStack_e08 = (uv_loop_t *)0x19638a;
    fs_write_alotof_bufs_with_offset_cold_14();
LAB_0019638a:
    puStack_e08 = (uv_loop_t *)0x196399;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00196399:
    puStack_e08 = (uv_loop_t *)0x1963a8;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_001963a8:
    puStack_e08 = (uv_loop_t *)0x1963b7;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_001963b7:
    puStack_e08 = (uv_loop_t *)0x1963c6;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_001963c6:
    puStack_e08 = (uv_loop_t *)0x1963d5;
    fs_write_alotof_bufs_with_offset_cold_9();
LAB_001963d5:
    puStack_e08 = (uv_loop_t *)0x1963e4;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_001963e4:
    puStack_e08 = (uv_loop_t *)0x1963f3;
    fs_write_alotof_bufs_with_offset_cold_11();
  }
  else {
    puStack_e08 = (uv_loop_t *)0x195ebc;
    iVar5 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    sVar4 = open_req1.result;
    if (iVar5 != 0) goto LAB_0019632b;
    if (open_req1.result < 0) goto LAB_0019633a;
    puStack_e08 = (uv_loop_t *)0x195f0d;
    uv_fs_req_cleanup(&open_req1);
    puStack_e08 = (uv_loop_t *)0x195f1e;
    uVar19 = uv_buf_init("0123456789",10);
    uVar11 = (uv_os_fd_t)sVar4;
    puStack_e08 = (uv_loop_t *)0x195f59;
    iov = uVar19;
    iVar5 = uv_fs_write((uv_loop_t *)0x0,&write_req,uVar11,&iov,1,-1,(uv_fs_cb)0x0);
    if (iVar5 != 10) goto LAB_00196349;
    if (write_req.result != 10) goto LAB_00196358;
    puStack_e08 = (uv_loop_t *)0x195fab;
    uv_fs_req_cleanup(&write_req);
    lVar15 = 8;
    do {
      puStack_e08 = (uv_loop_t *)0x195fc5;
      uVar19 = uv_buf_init(test_buf,0xd);
      *(char **)((long)puVar9->reserved + lVar15 + -0x40) = uVar19.base;
      *(size_t *)((long)puVar9->reserved + lVar15 + -0x38) = uVar19.len;
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0xd4318);
    puStack_e08 = (uv_loop_t *)0x195fff;
    iVar5 = uv_fs_write((uv_loop_t *)0x0,&write_req,uVar11,(uv_buf_t *)puVar9,0xd431,10,
                        (uv_fs_cb)0x0);
    if (iVar5 < 0) goto LAB_00196367;
    if (write_req.result != 0xac67d) goto LAB_00196376;
    puStack_e08 = (uv_loop_t *)0x19604c;
    uv_fs_req_cleanup(&write_req);
    puStack_e08 = (uv_loop_t *)0x196056;
    pcVar12 = (char *)malloc(0xac67d);
    if (pcVar12 == (char *)0x0) goto LAB_00196385;
    lVar15 = 8;
    pcVar16 = pcVar12;
    do {
      puStack_e08 = (uv_loop_t *)0x196078;
      uVar19 = uv_buf_init(pcVar16,0xd);
      *(char **)((long)puVar9->reserved + lVar15 + -0x40) = uVar19.base;
      *(size_t *)((long)puVar9->reserved + lVar15 + -0x38) = uVar19.len;
      lVar15 = lVar15 + 0x10;
      pcVar16 = pcVar16 + 0xd;
    } while (lVar15 != 0xd4318);
    puStack_e08 = (uv_loop_t *)0x1960bb;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,uVar11,(uv_buf_t *)puVar9,0xd431,10,(uv_fs_cb)0x0)
    ;
    if (iVar5 < 0) goto LAB_0019638a;
    lVar15 = 0xd;
    if (iVar5 != 0xd) {
      lVar15 = 0x3400;
    }
    if (read_req.result != lVar15) goto LAB_00196399;
    pcVar16 = pcVar12;
    uVar17 = 0;
    do {
      puStack_e08 = (uv_loop_t *)0x19612d;
      iVar7 = strncmp(pcVar16,test_buf,0xd);
      if (iVar7 != 0) {
        puStack_e08 = (uv_loop_t *)0x196326;
        fs_write_alotof_bufs_with_offset_cold_6();
        puVar8 = puVar9;
        goto LAB_00196326;
      }
      if (iVar5 == 0xd) break;
      pcVar16 = pcVar16 + 0xd;
      bVar18 = uVar17 < 0x3ff;
      uVar17 = uVar17 + 1;
    } while (bVar18);
    puStack_e08 = (uv_loop_t *)0x196172;
    uv_fs_req_cleanup(&read_req);
    puStack_e08 = (uv_loop_t *)0x19617a;
    free(pcVar12);
    puStack_e08 = (uv_loop_t *)0x196191;
    iVar5 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,"test_file",(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_001963a8;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_001963b7;
    puStack_e08 = (uv_loop_t *)0x1961f6;
    uv_fs_req_cleanup(&stat_req);
    puStack_e08 = (uv_loop_t *)0x196207;
    uVar19 = uv_buf_init(buf,0x20);
    puStack_e08 = (uv_loop_t *)0x196244;
    iov = uVar19;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,uVar11,&iov,1,write_req.result + 10,(uv_fs_cb)0x0)
    ;
    if (iVar5 != 0) goto LAB_001963c6;
    if (read_req.result != 0) goto LAB_001963d5;
    puStack_e08 = (uv_loop_t *)0x196291;
    uv_fs_req_cleanup(&read_req);
    puStack_e08 = (uv_loop_t *)0x1962a4;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,uVar11,(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_001963e4;
    if (close_req.result == 0) {
      puStack_e08 = (uv_loop_t *)0x1962f5;
      uv_fs_req_cleanup(&close_req);
      puStack_e08 = (uv_loop_t *)0x196301;
      unlink("test_file");
      free(puVar9);
      return extraout_EAX_05;
    }
  }
  puStack_e08 = (uv_loop_t *)run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_12();
  puStack_e08 = puVar9;
  loop = uv_default_loop();
  rmdir("test_dir");
  iVar5 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar5 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_00196631;
    iVar5 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,(uv_fs_cb)0x0);
    sVar4 = open_req1.result;
    if (iVar5 != 0) goto LAB_00196640;
    if (open_req1.result < 0) goto LAB_0019664f;
    uv_fs_req_cleanup(&open_req1);
    uVar19 = uv_buf_init(acStack_e0a,2);
    iov = uVar19;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_os_fd_t)sVar4,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar5 != -0x15) goto LAB_0019665e;
    uv_fs_req_cleanup(&read_req);
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)sVar4,(uv_fs_cb)0x0);
    if (iVar5 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      puVar8 = loop;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(puVar8,UV_RUN_DEFAULT);
      iVar5 = uv_loop_close(loop);
      if (iVar5 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0019667c;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_00196631:
    run_test_fs_read_dir_cold_2();
LAB_00196640:
    run_test_fs_read_dir_cold_3();
LAB_0019664f:
    run_test_fs_read_dir_cold_7();
LAB_0019665e:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_0019667c:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return 0;
}

Assistant:

TEST_IMPL(fs_scandir_empty_dir) {
  const char* path;
  uv_fs_t req;
  uv_dirent_t dent;
  int r;

  path = "./empty_dir/";
  loop = uv_default_loop();

  uv_fs_mkdir(NULL, &req, path, 0777, NULL);
  uv_fs_req_cleanup(&req);

  /* Fill the req to ensure that required fields are cleaned up */
  memset(&req, 0xdb, sizeof(req));

  r = uv_fs_scandir(NULL, &req, path, 0, NULL);
  ASSERT_OK(r);
  ASSERT_OK(req.result);
  ASSERT_NULL(req.ptr);
  ASSERT_EQ(UV_EOF, uv_fs_scandir_next(&req, &dent));
  uv_fs_req_cleanup(&req);

  r = uv_fs_scandir(loop, &scandir_req, path, 0, empty_scandir_cb);
  ASSERT_OK(r);

  ASSERT_OK(scandir_cb_count);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(1, scandir_cb_count);

  uv_fs_rmdir(NULL, &req, path, NULL);
  uv_fs_req_cleanup(&req);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}